

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockParameterTest.cpp
# Opt level: O0

void __thiscall
TEST_MockParameterTest_outputParameterWithIgnoredParameters_Test::testBody
          (TEST_MockParameterTest_outputParameterWithIgnoredParameters_Test *this)

{
  int iVar1;
  MockSupport *pMVar2;
  undefined4 extraout_var;
  long *plVar3;
  undefined4 extraout_var_00;
  MockActualCall *this_00;
  UtestShell *pUVar4;
  long lVar5;
  long lVar6;
  TestTerminator *pTVar7;
  SimpleString local_a8;
  SimpleString local_98;
  SimpleString local_88;
  SimpleString local_78;
  SimpleString local_68;
  SimpleString local_58;
  SimpleString local_48 [2];
  SimpleString local_28;
  int local_18;
  int local_14;
  int retval;
  int param;
  TEST_MockParameterTest_outputParameterWithIgnoredParameters_Test *this_local;
  
  local_14 = 1;
  local_18 = 2;
  _retval = this;
  SimpleString::SimpleString(&local_28,"");
  pMVar2 = mock(&local_28,(MockFailureReporter *)0x0);
  SimpleString::SimpleString(local_48,"foo");
  iVar1 = (*pMVar2->_vptr_MockSupport[3])(pMVar2,local_48);
  SimpleString::SimpleString(&local_58,"bar");
  plVar3 = (long *)(**(code **)(*(long *)CONCAT44(extraout_var,iVar1) + 0x30))
                             ((long *)CONCAT44(extraout_var,iVar1),&local_58,&local_14,4);
  (**(code **)(*plVar3 + 0x48))();
  SimpleString::~SimpleString(&local_58);
  SimpleString::~SimpleString(local_48);
  SimpleString::~SimpleString(&local_28);
  SimpleString::SimpleString(&local_68,"");
  pMVar2 = mock(&local_68,(MockFailureReporter *)0x0);
  SimpleString::SimpleString(&local_78,"foo");
  iVar1 = (*pMVar2->_vptr_MockSupport[6])(pMVar2,&local_78);
  SimpleString::SimpleString(&local_88,"bar");
  this_00 = (MockActualCall *)
            (**(code **)(*(long *)CONCAT44(extraout_var_00,iVar1) + 0x28))
                      ((long *)CONCAT44(extraout_var_00,iVar1),&local_88,&local_18);
  SimpleString::SimpleString(&local_98,"other");
  MockActualCall::withParameter(this_00,&local_98,1);
  SimpleString::~SimpleString(&local_98);
  SimpleString::~SimpleString(&local_88);
  SimpleString::~SimpleString(&local_78);
  SimpleString::~SimpleString(&local_68);
  pUVar4 = UtestShell::getCurrent();
  lVar5 = (long)local_14;
  lVar6 = (long)local_18;
  pTVar7 = UtestShell::getCurrentTestTerminator();
  (*pUVar4->_vptr_UtestShell[0xe])
            (pUVar4,lVar5,lVar6,"LONGS_EQUAL(param, retval) failed",
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockParameterTest.cpp"
             ,0x359,pTVar7);
  SimpleString::SimpleString(&local_a8,"");
  pMVar2 = mock(&local_a8,(MockFailureReporter *)0x0);
  (*pMVar2->_vptr_MockSupport[0x25])();
  SimpleString::~SimpleString(&local_a8);
  return;
}

Assistant:

TEST(MockParameterTest, outputParameterWithIgnoredParameters)
{
    int param = 1;
    int retval = 2;

    mock().expectOneCall("foo").withOutputParameterReturning("bar", &param, sizeof(param)).ignoreOtherParameters();
    mock().actualCall("foo").withOutputParameter("bar", &retval).withParameter("other", 1);

    LONGS_EQUAL(param, retval);

    mock().checkExpectations();
}